

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

char * Diligent::GetAdapterTypeString(ADAPTER_TYPE AdapterType,bool bGetEnumString)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  bool bGetEnumString_local;
  char *pcStack_10;
  ADAPTER_TYPE AdapterType_local;
  
  switch(AdapterType) {
  case ADAPTER_TYPE_UNKNOWN:
    pcStack_10 = "Unknown";
    if (bGetEnumString) {
      pcStack_10 = "ADAPTER_TYPE_UNKNOWN";
    }
    break;
  case ADAPTER_TYPE_SOFTWARE:
    pcStack_10 = "Software";
    if (bGetEnumString) {
      pcStack_10 = "ADAPTER_TYPE_SOFTWARE";
    }
    break;
  case ADAPTER_TYPE_INTEGRATED:
    pcStack_10 = "Integrated";
    if (bGetEnumString) {
      pcStack_10 = "ADAPTER_TYPE_INTEGRATED";
    }
    break;
  case ADAPTER_TYPE_DISCRETE:
    pcStack_10 = "Discrete";
    if (bGetEnumString) {
      pcStack_10 = "ADAPTER_TYPE_DISCRETE";
    }
    break;
  default:
    msg.field_2._M_local_buf[0xe] = bGetEnumString;
    msg.field_2._M_local_buf[0xf] = AdapterType;
    FormatString<char[33]>((string *)local_38,(char (*) [33])"Unknown/unsupported adapter type");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetAdapterTypeString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x658);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

const char* GetAdapterTypeString(ADAPTER_TYPE AdapterType, bool bGetEnumString)
{
    static_assert(ADAPTER_TYPE_COUNT == 4, "Did you add a new adapter type? Please update the switch below.");
    switch (AdapterType)
    {
        // clang-format off
        case ADAPTER_TYPE_UNKNOWN:    return bGetEnumString ? "ADAPTER_TYPE_UNKNOWN"    : "Unknown";    break;
        case ADAPTER_TYPE_SOFTWARE:   return bGetEnumString ? "ADAPTER_TYPE_SOFTWARE"   : "Software";   break;
        case ADAPTER_TYPE_INTEGRATED: return bGetEnumString ? "ADAPTER_TYPE_INTEGRATED" : "Integrated"; break;
        case ADAPTER_TYPE_DISCRETE:   return bGetEnumString ? "ADAPTER_TYPE_DISCRETE"   : "Discrete";   break;
        // clang-format on
        default: UNEXPECTED("Unknown/unsupported adapter type"); return "UNKNOWN";
    }
}